

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O3

void addRec(PlayerInfo *player,int amount)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_prefix;
  string local_38;
  
  in_string._M_str = (player->uuid)._M_dataplus._M_p;
  in_string._M_len = (player->uuid)._M_string_length;
  in_prefix._M_str = "Player";
  in_prefix._M_len = 6;
  sVar1 = jessilib::starts_with_lengthi<char,char>(in_string,in_prefix);
  if ((sVar1 == 0) && (player->isBot == false)) {
    puVar2 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
    uVar3 = Jupiter::Config::operator[](&player->varData,puVar2[1],*puVar2);
    uVar4 = getRecs(player);
    string_printf_abi_cxx11_(&local_38,"%u",(long)amount + uVar4);
    Jupiter::Config::set(uVar3,4,"Recs",&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void addRec(const RenX::PlayerInfo &player, int amount) {
	if (!jessilib::starts_withi(player.uuid, "Player"sv) && !player.isBot) {
		player.varData[pluginInstance.getName()].set("Recs"sv, static_cast<std::string>(string_printf("%u", getRecs(player) + amount)));
	}
}